

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ui-player.c
# Opt level: O3

void display_player_xtra_info(void)

{
  panel *p;
  long lVar1;
  
  lVar1 = 0;
  do {
    p = (panel *)(**(code **)((long)&panels[0].panel + lVar1))();
    display_panel(p,*(_Bool *)(lVar1 + 0x2d0a50),(region *)((long)&panels[0].bounds.col + lVar1));
    panel_free(p);
    lVar1 = lVar1 + 0x20;
  } while (lVar1 != 0xa0);
  text_out_wrap = L'H';
  text_out_indent = L'\x01';
  Term_gotoxy(L'\x01',L'\x13');
  text_out_to_screen('\x01',player->history);
  text_out_wrap = L'\0';
  text_out_indent = L'\0';
  return;
}

Assistant:

void display_player_xtra_info(void)
{
	size_t i;
	for (i = 0; i < N_ELEMENTS(panels); i++) {
		struct panel *p = panels[i].panel();
		display_panel(p, panels[i].align_left, &panels[i].bounds);
		panel_free(p);
	}

	/* Indent output by 1 character, and wrap at column 72 */
	text_out_wrap = 72;
	text_out_indent = 1;

	/* History */
	Term_gotoxy(text_out_indent, 19);
	text_out_to_screen(COLOUR_WHITE, player->history);

	/* Reset text_out() vars */
	text_out_wrap = 0;
	text_out_indent = 0;

	return;
}